

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

time_point32 libtorrent::aux::from_time_t(time_t t)

{
  int local_64;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  r;
  time_point lt_now;
  time_point sys_now;
  time_point tp;
  time_t t_local;
  
  if (t == 0) {
    tp.__d.__r._0_4_ = 0;
    ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
              ((duration<int,std::ratio<1l,1l>> *)((long)&tp.__d.__r + 4),(int *)&tp);
    ::std::chrono::
    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::
    time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                *)((long)&t_local + 4),(duration *)((long)&tp.__d.__r + 4));
  }
  else {
    sys_now = ::std::chrono::_V2::system_clock::from_time_t(t);
    lt_now.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
    r.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
    local_50.__r = (rep)::std::chrono::operator-(&sys_now,&lt_now);
    local_48.__r = (rep)::std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_50);
    local_40 = ::std::chrono::operator+(&r,&local_48);
    local_64 = 500;
    ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_60,&local_64);
    local_58 = ::std::chrono::operator+(&local_40,&local_60);
    t_local._4_4_ =
         ::std::chrono::
         time_point_cast<std::chrono::duration<int,std::ratio<1l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   (&local_58);
  }
  return (time_point32)t_local._4_4_;
}

Assistant:

time_point32 from_time_t(const std::time_t t)
	{
		// special case for unset value
		if (t == 0) return time_point32(seconds32(0));

		const auto tp = system_clock::from_time_t(t);
		const auto sys_now = system_clock::now();
		const auto lt_now = clock_type::now();

		auto r = lt_now + std::chrono::duration_cast<clock_type::duration>(tp - sys_now);
		// the conversion to seconds will truncate, make sure we round
		return std::chrono::time_point_cast<seconds32>(r + milliseconds(500));
	}